

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedBindingUpdate::Setup(AdvancedBindingUpdate *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,this->m_vao);
  glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_vbo);
  glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_ebo);
  this->m_vsp = 0;
  this->m_fsp = 0;
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_ppo);
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenVertexArrays(2, m_vao);
		glGenBuffers(2, m_vbo);
		glGenBuffers(2, m_ebo);
		m_vsp = m_fsp = 0;
		glGenProgramPipelines(1, &m_ppo);
		return NO_ERROR;
	}